

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::
Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
::Matcher(Matcher<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
          *this,pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
                *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *local_a0;
  long local_98;
  long local_90 [2];
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  MatcherBase<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
  local_70;
  EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
  local_58;
  
  (this->
  super_MatcherBase<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
  ).vtable_ = (VTable *)0x0;
  (this->
  super_MatcherBase<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00272150;
  pcVar2 = (value->first)._M_dataplus._M_p;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (value->first)._M_string_length);
  local_80 = (undefined4)(value->second).addr.a_.a_;
  uStack_7c = *(undefined4 *)((long)&(value->second).addr.a_.a_ + 4);
  uStack_78 = (undefined4)(value->second).size;
  uStack_74 = *(undefined4 *)((long)&(value->second).size + 4);
  paVar1 = &local_58.
            super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
            .rhs_.first.field_2;
  local_58.
  super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
  .rhs_.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_a0,local_98 + (long)local_a0);
  local_58.
  super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
  .rhs_.second.addr.a_.a_._4_4_ = uStack_7c;
  local_58.
  super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
  .rhs_.second.addr.a_.a_._0_4_ = local_80;
  local_58.
  super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
  .rhs_.second.size = CONCAT44(uStack_74,uStack_78);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002721c0;
  local_70.vtable_ =
       (VTable *)
       internal::MatcherBase<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>::
       GetVTable<testing::internal::MatcherBase<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>::ValuePolicy<testing::internal::EqMatcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>>,false>>()
       ::kVTable_abi_cxx11_;
  internal::MatcherBase<std::pair<std::__cxx11::string_const,pstore::extent<char>>const&>::
  ValuePolicy<testing::internal::EqMatcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>>,false>
  ::Init<testing::internal::EqMatcher<std::pair<std::__cxx11::string_const,pstore::extent<char>>>>
            (&local_70,&local_58);
  local_70.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00272150;
  internal::
  MatcherBase<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
  ::operator=(&this->
               super_MatcherBase<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
              ,&local_70);
  internal::
  MatcherBase<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_&>
  ::~MatcherBase(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.
         super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
         .rhs_.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.
                    super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
                    .rhs_.first._M_dataplus._M_p,
                    local_58.
                    super_ComparisonBase<testing::internal::EqMatcher<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_testing::internal::AnyEq>
                    .rhs_.first.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }